

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  service srv;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  cppcms::service::service(&srv,argc,argv);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(uVar1,local_40,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  local_30._8_8_ = 0;
  local_18 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_20 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_30._M_unused._M_object = &srv;
  cppcms::service::after_fork((function *)&srv);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  cppcms::service::run();
  cppcms::service::~service(&srv);
  return run_ok ^ 1;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}